

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

bigint<13> * __thiscall bigint<13>::add<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  
  iVar1 = x->len;
  iVar7 = y->len;
  uVar6 = 0;
  if (0 < (long)iVar7) {
    bVar8 = true;
    uVar2 = 0;
    do {
      uVar3 = 0;
      if ((long)uVar6 < (long)iVar1) {
        uVar3 = (uint)x->digits[uVar6];
      }
      uVar4 = 0;
      if (bVar8) {
        uVar4 = (uint)y->digits[uVar6];
      }
      uVar4 = uVar3 + uVar2 + uVar4;
      this->digits[uVar6] = (digit)uVar4;
      uVar2 = uVar4 >> 0x10;
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < (ulong)(long)iVar7;
    } while ((bVar8) || (0xffff < uVar4));
  }
  iVar5 = (int)uVar6;
  if (this != x && iVar5 < iVar1) {
    memcpy(this->digits + (uVar6 & 0xffffffff),x->digits + (uVar6 & 0xffffffff),
           (long)(iVar1 - iVar5) * 2);
  }
  if (iVar7 < iVar1) {
    iVar7 = iVar1;
  }
  if (iVar7 < iVar5) {
    iVar7 = iVar5;
  }
  this->len = iVar7;
  return this;
}

Assistant:

bigint &add(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        dbldigit carry = 0;
        int maxlen = max(x.len, y.len), i;
        for(i = 0; i < y.len || carry; i++)
        {
             carry += (i < x.len ? (dbldigit)x.digits[i] : 0) + (i < y.len ? (dbldigit)y.digits[i] : 0);
             digits[i] = (digit)carry;
             carry >>= BI_DIGIT_BITS;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = max(i, maxlen);
        return *this;
    }